

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

int __thiscall ON_ClippingRegion::TransformPoints(ON_ClippingRegion *this,int count,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint uVar12;
  uint uVar13;
  double *pdVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  iVar16 = this->m_clip_plane_count;
  dVar1 = this->m_clip_plane_tolerance;
  uVar12 = 0;
  uVar13 = 0xffffffff;
  do {
    bVar20 = count == 0;
    count = count + -1;
    if (bVar20) goto LAB_003e1354;
    if (iVar16 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      uVar18 = 0x40;
      pdVar14 = (double *)&this->field_0x110;
      iVar15 = iVar16;
      do {
        uVar19 = uVar18;
        if (-dVar1 <= pdVar14[3] * p->w + pdVar14[2] * p->z + *pdVar14 * p->x + pdVar14[1] * p->y) {
          uVar19 = 0;
        }
        uVar17 = uVar17 | uVar19;
        uVar18 = uVar18 * 2;
        pdVar14 = pdVar14 + 4;
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    dVar22 = p->x;
    dVar2 = p->y;
    dVar3 = p->z;
    dVar4 = p->w;
    dVar21 = (this->m_xform).m_xform[3][3] * dVar4 +
             (this->m_xform).m_xform[3][2] * dVar3 +
             (this->m_xform).m_xform[3][0] * dVar22 + (this->m_xform).m_xform[3][1] * dVar2;
    dVar23 = (this->m_xform).m_xform[0][3] * dVar4 +
             (this->m_xform).m_xform[0][2] * dVar3 +
             (this->m_xform).m_xform[0][0] * dVar22 + (this->m_xform).m_xform[0][1] * dVar2;
    dVar24 = -dVar21;
    if (dVar24 <= dVar23) {
      if (dVar21 < dVar23) {
        uVar17 = uVar17 | 2;
      }
    }
    else {
      uVar17 = uVar17 | 1;
    }
    dVar25 = (this->m_xform).m_xform[1][3] * dVar4 +
             (this->m_xform).m_xform[1][2] * dVar3 +
             (this->m_xform).m_xform[1][0] * dVar22 + (this->m_xform).m_xform[1][1] * dVar2;
    if (dVar24 <= dVar25) {
      if (dVar21 < dVar25) {
        uVar17 = uVar17 | 8;
      }
    }
    else {
      uVar17 = uVar17 | 4;
    }
    dVar22 = dVar4 * (this->m_xform).m_xform[2][3] +
             dVar3 * (this->m_xform).m_xform[2][2] +
             dVar22 * (this->m_xform).m_xform[2][0] + dVar2 * (this->m_xform).m_xform[2][1];
    if (dVar24 <= dVar22) {
      if (dVar21 < dVar22) {
        uVar17 = uVar17 | 0x20;
      }
    }
    else {
      uVar17 = uVar17 | 0x10;
    }
    p->x = dVar23;
    p->y = dVar25;
    p->z = dVar22;
    p->w = dVar21;
    p = p + 1;
    uVar12 = uVar12 | uVar17;
    uVar13 = uVar13 & uVar17;
  } while (uVar13 != 0 || uVar12 == 0);
  if (count != 0) {
    iVar16 = 0;
    do {
      dVar1 = p->x;
      dVar22 = p->y;
      dVar2 = p->z;
      dVar3 = p->w;
      dVar4 = (this->m_xform).m_xform[1][1];
      dVar21 = (this->m_xform).m_xform[1][0];
      dVar23 = (this->m_xform).m_xform[1][2];
      dVar24 = (this->m_xform).m_xform[1][3];
      dVar25 = (this->m_xform).m_xform[2][1];
      dVar5 = (this->m_xform).m_xform[2][0];
      dVar6 = (this->m_xform).m_xform[2][2];
      dVar7 = (this->m_xform).m_xform[2][3];
      dVar8 = (this->m_xform).m_xform[3][1];
      dVar9 = (this->m_xform).m_xform[3][0];
      dVar10 = (this->m_xform).m_xform[3][2];
      dVar11 = (this->m_xform).m_xform[3][3];
      p->x = (this->m_xform).m_xform[0][3] * dVar3 +
             (this->m_xform).m_xform[0][2] * dVar2 +
             (this->m_xform).m_xform[0][0] * dVar1 + (this->m_xform).m_xform[0][1] * dVar22;
      p->y = dVar24 * dVar3 + dVar23 * dVar2 + dVar21 * dVar1 + dVar4 * dVar22;
      p->z = dVar7 * dVar3 + dVar6 * dVar2 + dVar5 * dVar1 + dVar25 * dVar22;
      p->w = dVar3 * dVar11 + dVar2 * dVar10 + dVar1 * dVar9 + dVar22 * dVar8;
      p = p + 1;
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
LAB_003e1354:
  iVar16 = (uVar12 == 0) + 1;
  if (uVar13 != 0) {
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

int ON_ClippingRegion::TransformPoints( int count, ON_4dPoint* p ) const
{
  // transforms cv's to pick coordinates
  const double* xform;
  const ON_PlaneEquation* cpeqn;
  double* cv;
  double x, y, z, w;
  unsigned int out, all_out, some_out, cpbit;
  int i, j;
  
  // 14 May 2012 Dale Lear
  //   Fix http://dev.mcneel.com/bugtrack/?q=102481
  //   Picking hatches that are coplanar with clipping planes.
  //   The "fix" was to set clipping_plane_tolerance = same
  //   tolerance the display code uses.  Before the fix,
  //   0.0 was used as the clipping_plane_tolerance.
  const double clip_plane_tolerance = ClipPlaneTolerance();

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  i = count;
  while (i--) 
  {
    out = 0;
    if ( m_clip_plane_count )
    {
      cpbit = 0x40;
      cpeqn = m_clip_plane;
      j = m_clip_plane_count;
      while (j--)
      {
        x = cpeqn->x*cv[0] + cpeqn->y*cv[1] + cpeqn->z*cv[2] + cpeqn->d*cv[3];
        if ( x < -clip_plane_tolerance )
          out |= cpbit;
        cpbit <<= 1;
        cpeqn++;
      }
    }
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
    if (x < -w) out |= 0x01; else if (x > w) out |= 0x02;
    y = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
    if (y < -w) out |= 0x04; else if (y > w) out |= 0x08;
    z = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
    if (z < -w) out |= 0x10; else if (z > w) out |= 0x20;
    *cv++ = x; *cv++ = y; *cv++ = z; *cv++ = w;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      while (i--)
      {
        x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
        y = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
        z = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
        w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
        *cv++ = x; *cv++ = y; *cv++ = z; *cv++ = w;
      }
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}